

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

UChar * ures_getStringByIndex_63
                  (UResourceBundle *resB,int32_t indexS,int32_t *len,UErrorCode *status)

{
  Resource r;
  uint array;
  UChar *pUVar1;
  char *key;
  char *local_28;
  
  local_28 = (char *)0x0;
  if (status == (UErrorCode *)0x0) {
    return (UChar *)0x0;
  }
  if (U_ZERO_ERROR < *status) {
    return (UChar *)0x0;
  }
  if (resB == (UResourceBundle *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return (UChar *)0x0;
  }
  if ((indexS < 0) || (resB->fSize <= indexS)) {
    *status = U_MISSING_RESOURCE_ERROR;
    return (UChar *)0x0;
  }
  array = resB->fRes;
  switch(array >> 0x1c) {
  case 0:
  case 6:
    pUVar1 = res_getString_63(&resB->fResData,array,len);
    return pUVar1;
  case 1:
  case 7:
  case 0xe:
    *status = U_RESOURCE_TYPE_MISMATCH;
    break;
  case 2:
  case 4:
  case 5:
    r = res_getTableItemByIndex_63(&resB->fResData,array,indexS,&local_28);
    pUVar1 = ures_getStringWithAlias(resB,r,indexS,len,status);
    return pUVar1;
  case 3:
    goto LAB_00371960;
  case 8:
  case 9:
    array = res_getArrayItem_63(&resB->fResData,array,indexS);
LAB_00371960:
    pUVar1 = ures_getStringWithAlias(resB,array,indexS,len,status);
    return pUVar1;
  default:
    *status = U_INTERNAL_PROGRAM_ERROR;
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI const UChar* U_EXPORT2 ures_getStringByIndex(const UResourceBundle *resB, int32_t indexS, int32_t* len, UErrorCode *status) {
    const char* key = NULL;
    Resource r = RES_BOGUS;

    if (status==NULL || U_FAILURE(*status)) {
        return NULL;
    }
    if(resB == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(indexS >= 0 && resB->fSize > indexS) {
        switch(RES_GET_TYPE(resB->fRes)) {
        case URES_STRING:
        case URES_STRING_V2:
            return res_getString(&(resB->fResData), resB->fRes, len);
        case URES_TABLE:
        case URES_TABLE16:
        case URES_TABLE32:
            r = res_getTableItemByIndex(&(resB->fResData), resB->fRes, indexS, &key);
            if(r == RES_BOGUS && resB->fHasFallback) {
                /* TODO: do the fallback */
            }
            return ures_getStringWithAlias(resB, r, indexS, len, status);
        case URES_ARRAY:
        case URES_ARRAY16:
            r = res_getArrayItem(&(resB->fResData), resB->fRes, indexS);
            if(r == RES_BOGUS && resB->fHasFallback) {
                /* TODO: do the fallback */
            }
            return ures_getStringWithAlias(resB, r, indexS, len, status);
        case URES_ALIAS:
            return ures_getStringWithAlias(resB, resB->fRes, indexS, len, status);
        case URES_INT:
        case URES_BINARY:
        case URES_INT_VECTOR:
            *status = U_RESOURCE_TYPE_MISMATCH;
            break;
        default:
          /* must not occur */
          *status = U_INTERNAL_PROGRAM_ERROR;
          break;
        }
    } else {
        *status = U_MISSING_RESOURCE_ERROR;
    }
    return NULL;
}